

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O1

key_components * dsa_components(ssh_key *key)

{
  key_components *kc;
  
  kc = key_components_new();
  key_components_add_text(kc,"key_type","DSA");
  if (key[-5].vt != (ssh_keyalg *)0x0) {
    key_components_add_mp(kc,"p",(mp_int *)key[-5].vt);
    key_components_add_mp(kc,"q",(mp_int *)key[-4].vt);
    key_components_add_mp(kc,"g",(mp_int *)key[-3].vt);
    key_components_add_mp(kc,"public_y",(mp_int *)key[-2].vt);
    if (key[-1].vt != (ssh_keyalg *)0x0) {
      key_components_add_mp(kc,"private_x",(mp_int *)key[-1].vt);
    }
    return kc;
  }
  __assert_fail("dsa->p",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/dsa.c",
                0x5e,"key_components *dsa_components(ssh_key *)");
}

Assistant:

static key_components *dsa_components(ssh_key *key)
{
    struct dsa_key *dsa = container_of(key, struct dsa_key, sshk);
    key_components *kc = key_components_new();

    key_components_add_text(kc, "key_type", "DSA");
    assert(dsa->p);
    key_components_add_mp(kc, "p", dsa->p);
    key_components_add_mp(kc, "q", dsa->q);
    key_components_add_mp(kc, "g", dsa->g);
    key_components_add_mp(kc, "public_y", dsa->y);
    if (dsa->x)
        key_components_add_mp(kc, "private_x", dsa->x);

    return kc;
}